

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall
NumberTemp::ProcessPropertySymUse
          (NumberTemp *this,SymOpnd *symOpnd,Instr *instr,BackwardPass *backwardPass)

{
  ushort uVar1;
  Type pJVar2;
  Opnd *this_00;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  SymID SVar6;
  undefined4 *puVar7;
  PropertySym *propertySym;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *this_01;
  BVSparse<Memory::JitArenaAllocator> **ppBVar8;
  NumberTemp *this_02;
  RegOpnd *pRVar9;
  char16_t *pcVar10;
  char16_t *pcVar11;
  
  bVar4 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x381,"(backwardPass->DoMarkTempNumbersOnTempObjects())",
                       "backwardPass->DoMarkTempNumbersOnTempObjects()");
    if (!bVar4) goto LAB_005be2c6;
    *puVar7 = 0;
  }
  bVar4 = IsTempPropertyTransferLoad(this,instr,backwardPass);
  if (bVar4) {
    propertySym = Sym::AsPropertySym(symOpnd->m_sym);
    BVSparse<Memory::JitArenaAllocator>::Set
              (&this->upwardExposedMarkTempObjectLiveFields,(propertySym->super_Sym).m_id);
    this_01 = this->upwardExposedMarkTempObjectSymsProperties;
    if (this_01 == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)
    {
      this_01 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::New
                          (&((this->super_TempTrackerBase).nonTempSyms.alloc)->super_ArenaAllocator,
                           0x10);
      this->upwardExposedMarkTempObjectSymsProperties = this_01;
    }
    ppBVar8 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
              FindOrInsertNew(this_01,(propertySym->m_stackSym->super_Sym).m_id);
    this_02 = (NumberTemp *)*ppBVar8;
    if (this_02 == (NumberTemp *)0x0) {
      this_02 = (NumberTemp *)
                new<Memory::JitArenaAllocator>
                          (0x20,(this->super_TempTrackerBase).nonTempSyms.alloc,0x3d6ef4);
      pJVar2 = (this->super_TempTrackerBase).nonTempSyms.alloc;
      (this_02->super_TempTrackerBase).nonTempSyms.head = (Type_conflict)0x0;
      (this_02->super_TempTrackerBase).nonTempSyms.lastFoundIndex = (Type_conflict)0x0;
      (this_02->super_TempTrackerBase).nonTempSyms.alloc = pJVar2;
      (this_02->super_TempTrackerBase).nonTempSyms.lastUsedNodePrevNextField = (Type)this_02;
      *ppBVar8 = (BVSparse<Memory::JitArenaAllocator> *)this_02;
    }
    BVSparse<Memory::JitArenaAllocator>::Set
              ((BVSparse<Memory::JitArenaAllocator> *)this_02,propertySym->m_propertyId);
    SVar6 = GetRepresentativePropertySymId(this_02,propertySym,backwardPass);
    uVar1 = *(ushort *)&instr->field_0x36;
    if ((uVar1 & 2) == 0) {
      BVSparse<Memory::JitArenaAllocator>::Set((BVSparse<Memory::JitArenaAllocator> *)this,SVar6);
    }
    else if (this->propertyIdsTempTransferDependencies !=
             (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
      BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((BVSparse<Memory::JitArenaAllocator> *)this,SVar6);
      if (BVar5 == '\0') {
        this_00 = instr->m_dst;
        bVar4 = IR::Opnd::IsRegOpnd(this_00);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                             ,0x3a2,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
          if (!bVar4) {
LAB_005be2c6:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
        pRVar9 = IR::Opnd::AsRegOpnd(this_00);
        SVar6 = (pRVar9->m_sym->super_Sym).m_id;
        TempTrackerBase::AddTransferDependencies
                  (&this->super_TempTrackerBase,propertySym->m_propertyId,SVar6,
                   this->propertyIdsTempTransferDependencies);
        bVar4 = DoTrace(backwardPass);
        if (bVar4) {
          pcVar11 = L"Prepass ";
          if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
            pcVar11 = L"";
          }
          Output::Print(L"%s: %8s s%d -> PropId:%d: ",L"MarkTempNumber",pcVar11,SVar6,
                        (ulong)(uint)propertySym->m_propertyId);
          ppBVar8 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                              (this->propertyIdsTempTransferDependencies,propertySym->m_propertyId);
          BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar8);
        }
      }
    }
    bVar4 = DoTrace(backwardPass);
    if (bVar4) {
      pcVar11 = L"Prepass ";
      if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
        pcVar11 = L"";
      }
      pcVar10 = L"Non ";
      if ((uVar1 & 2) != 0) {
        pcVar10 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use (PropId:%d)",L"MarkTempNumber",pcVar11,pcVar10,
                    (ulong)(uint)propertySym->m_propertyId);
      IR::Instr::DumpSimple(instr);
      return;
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessPropertySymUse(IR::SymOpnd * symOpnd, IR::Instr * instr, BackwardPass * backwardPass)
{
    Assert(backwardPass->DoMarkTempNumbersOnTempObjects());

    // We only care about instruction that may transfer the property value
    if (!NumberTemp::IsTempPropertyTransferLoad(instr, backwardPass))
    {
        return;
    }

    PropertySym * propertySym = symOpnd->m_sym->AsPropertySym();
    upwardExposedMarkTempObjectLiveFields.Set(propertySym->m_id);
    if (upwardExposedMarkTempObjectSymsProperties == nullptr)
    {
        upwardExposedMarkTempObjectSymsProperties = HashTable<BVSparse<JitArenaAllocator> *>::New(this->GetAllocator(), 16);
    }
    BVSparse<JitArenaAllocator> ** bv = upwardExposedMarkTempObjectSymsProperties->FindOrInsertNew(propertySym->m_stackSym->m_id);
    if (*bv == nullptr)
    {
        *bv = JitAnew(this->GetAllocator(), BVSparse<JitArenaAllocator>, this->GetAllocator());
    }
    (*bv)->Set(propertySym->m_propertyId);

    SymID propertySymId = this->GetRepresentativePropertySymId(propertySym, backwardPass);
    bool isTempUse = instr->dstIsTempNumber;
    if (!isTempUse)
    {
        // Use of the value is non temp, track the property ID's property representative sym so we don't mark temp
        // assignment to this property on stack objects.
        this->nonTempSyms.Set(propertySymId);
    }
    else if (this->IsInLoop() && !this->nonTempSyms.Test(propertySymId))
    {
        // We didn't already detect non temp use of this property id. so we should track the dependencies in loops
        IR::Opnd * dstOpnd = instr->GetDst();
        Assert(dstOpnd->IsRegOpnd());
        SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;
        AddTransferDependencies(propertySym->m_propertyId, dstSymID, this->propertyIdsTempTransferDependencies);
#if DBG_DUMP
        if (NumberTemp::DoTrace(backwardPass))
        {
            Output::Print(_u("%s: %8s s%d -> PropId:%d: "), NumberTemp::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID, propertySym->m_propertyId);
            (*this->propertyIdsTempTransferDependencies->Get(propertySym->m_propertyId))->Dump();
        }
#endif
    }

#if DBG_DUMP
    if (NumberTemp::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use (PropId:%d)"), NumberTemp::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "), propertySym->m_propertyId);
        instr->DumpSimple();
    }
#endif
}